

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O2

Keylet * jbcoin::keylet::payChan
                   (Keylet *__return_storage_ptr__,AccountID *source,AccountID *dst,uint32_t seq)

{
  sha512_half_hasher h;
  
  SHA512_Init((SHA512_CTX *)&h);
  beast::hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,unsigned_short>
            ((basic_sha512_half_hasher<false> *)&h,0x78);
  hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,void>
            ((basic_sha512_half_hasher<false> *)&h,source);
  hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,void>
            ((basic_sha512_half_hasher<false> *)&h,dst);
  beast::hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,unsigned_int>
            ((basic_sha512_half_hasher<false> *)&h,seq);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (&__return_storage_ptr__->key,(basic_sha512_half_hasher *)&h);
  __return_storage_ptr__->type = ltPAYCHAN;
  return __return_storage_ptr__;
}

Assistant:

Keylet
payChan (AccountID const& source, AccountID const& dst, std::uint32_t seq)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, std::uint16_t(spaceXRPUChannel));
    hash_append(h, source);
    hash_append(h, dst);
    hash_append(h, seq);
    return { ltPAYCHAN, static_cast<uint256>(h) };
}